

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

wchar_t __thiscall CharConv::readch(CharConv *this,CVmDataSource *src)

{
  int iVar1;
  undefined8 in_RAX;
  char buf [1];
  char local_1;
  
  local_1 = (char)((ulong)in_RAX >> 0x38);
  iVar1 = (*src->_vptr_CVmDataSource[2])(src,&local_1,1);
  if (iVar1 == 0) {
    return (int)local_1;
  }
  err_throw(0x65);
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read a byte into our buffer */
        char buf[1];
        if (src->read(buf, 1))
            err_throw(VMERR_READ_FILE);

        /* return the character */
        return buf[0];
    }